

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

EffectiveSign __thiscall
slang::ast::ConditionalExpression::getEffectiveSignImpl
          (ConditionalExpression *this,bool isForConversion)

{
  EffectiveSign EVar1;
  EffectiveSign right;
  Expression *this_00;
  Expression *this_01;
  
  if (this->isConst == false) {
    this_01 = this->left_;
  }
  else {
    this_01 = this->left_;
    this_00 = this_01;
    if (this->isTrue == false) {
      this_00 = this->right_;
    }
    if (this_00 != (Expression *)0x0) {
      EVar1 = Expression::getEffectiveSign(this_00,isForConversion);
      return EVar1;
    }
  }
  EVar1 = Expression::getEffectiveSign(this_01,isForConversion);
  right = Expression::getEffectiveSign(this->right_,isForConversion);
  EVar1 = Expression::conjunction(EVar1,right);
  return EVar1;
}

Assistant:

Expression::EffectiveSign ConditionalExpression::getEffectiveSignImpl(bool isForConversion) const {
    if (auto branch = knownSide())
        return branch->getEffectiveSign(isForConversion);
    return conjunction(left().getEffectiveSign(isForConversion),
                       right().getEffectiveSign(isForConversion));
}